

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder__full_decode_and_uninit
                    (ma_decoder *pDecoder,ma_decoder_config *pConfigOut,ma_uint64 *pFrameCountOut,
                    void **ppPCMFramesOut)

{
  ma_result mVar1;
  void *pvVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  ma_uint64 newDataCapInFrames;
  void *pNewPCMFramesOut;
  ma_uint64 framesJustRead;
  ma_uint64 frameCountToTryReading;
  void *pPCMFramesOut;
  ma_uint64 dataCapInFrames;
  ma_uint64 bpf;
  ma_uint64 totalFrameCount;
  ma_result result;
  ma_uint64 *in_stack_00001018;
  ma_uint64 in_stack_00001020;
  void *in_stack_00001028;
  ma_decoder *in_stack_00001030;
  ma_decoder *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  void *local_58;
  ma_decoder *local_50;
  ma_decoder *local_40;
  
  local_40 = (ma_decoder *)0x0;
  ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x88));
  local_50 = (ma_decoder *)0x0;
  local_58 = (void *)0x0;
  do {
    if (local_40 == local_50) {
      in_stack_ffffffffffffff88 = (ma_decoder *)((long)local_50 << 1);
      if (in_stack_ffffffffffffff88 == (ma_decoder *)0x0) {
        in_stack_ffffffffffffff88 = (ma_decoder *)0x1000;
      }
      in_stack_ffffffffffffff90 =
           ma_realloc(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                      (ma_allocation_callbacks *)in_stack_ffffffffffffff88);
      local_58 = in_stack_ffffffffffffff90;
      local_50 = in_stack_ffffffffffffff88;
      if (in_stack_ffffffffffffff90 == (void *)0x0) {
        ma_free((void *)0x0,(ma_allocation_callbacks *)in_stack_ffffffffffffff88);
        return MA_OUT_OF_MEMORY;
      }
    }
    pvVar2 = (void *)((long)local_50 - (long)local_40);
    mVar1 = ma_decoder_read_pcm_frames
                      (in_stack_00001030,in_stack_00001028,in_stack_00001020,in_stack_00001018);
    local_40 = (ma_decoder *)((long)in_stack_ffffffffffffff98 + (long)local_40);
    if ((mVar1 != MA_SUCCESS) || (in_stack_ffffffffffffff98 < pvVar2)) {
      if (in_RSI != (undefined4 *)0x0) {
        *in_RSI = *(undefined4 *)(in_RDI + 0x88);
        in_RSI[1] = *(undefined4 *)(in_RDI + 0x8c);
        in_RSI[2] = *(undefined4 *)(in_RDI + 0x90);
      }
      if (in_RCX == (undefined8 *)0x0) {
        ma_free(in_stack_ffffffffffffff90,(ma_allocation_callbacks *)in_stack_ffffffffffffff88);
      }
      else {
        *in_RCX = local_58;
      }
      if (in_RDX != (long *)0x0) {
        *in_RDX = (long)local_40;
      }
      ma_decoder_uninit(in_stack_ffffffffffffff88);
      return MA_SUCCESS;
    }
  } while( true );
}

Assistant:

static ma_result ma_decoder__full_decode_and_uninit(ma_decoder* pDecoder, ma_decoder_config* pConfigOut, ma_uint64* pFrameCountOut, void** ppPCMFramesOut)
{
    ma_result result;
    ma_uint64 totalFrameCount;
    ma_uint64 bpf;
    ma_uint64 dataCapInFrames;
    void* pPCMFramesOut;

    MA_ASSERT(pDecoder != NULL);

    totalFrameCount = 0;
    bpf = ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels);

    /* The frame count is unknown until we try reading. Thus, we just run in a loop. */
    dataCapInFrames = 0;
    pPCMFramesOut = NULL;
    for (;;) {
        ma_uint64 frameCountToTryReading;
        ma_uint64 framesJustRead;

        /* Make room if there's not enough. */
        if (totalFrameCount == dataCapInFrames) {
            void* pNewPCMFramesOut;
            ma_uint64 newDataCapInFrames = dataCapInFrames*2;
            if (newDataCapInFrames == 0) {
                newDataCapInFrames = 4096;
            }

            if ((newDataCapInFrames * bpf) > MA_SIZE_MAX) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_TOO_BIG;
            }

            pNewPCMFramesOut = (void*)ma_realloc(pPCMFramesOut, (size_t)(newDataCapInFrames * bpf), &pDecoder->allocationCallbacks);
            if (pNewPCMFramesOut == NULL) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_OUT_OF_MEMORY;
            }

            dataCapInFrames = newDataCapInFrames;
            pPCMFramesOut = pNewPCMFramesOut;
        }

        frameCountToTryReading = dataCapInFrames - totalFrameCount;
        MA_ASSERT(frameCountToTryReading > 0);

        result = ma_decoder_read_pcm_frames(pDecoder, (ma_uint8*)pPCMFramesOut + (totalFrameCount * bpf), frameCountToTryReading, &framesJustRead);
        totalFrameCount += framesJustRead;

        if (result != MA_SUCCESS) {
            break;
        }

        if (framesJustRead < frameCountToTryReading) {
            break;
        }
    }


    if (pConfigOut != NULL) {
        pConfigOut->format     = pDecoder->outputFormat;
        pConfigOut->channels   = pDecoder->outputChannels;
        pConfigOut->sampleRate = pDecoder->outputSampleRate;
    }

    if (ppPCMFramesOut != NULL) {
        *ppPCMFramesOut = pPCMFramesOut;
    } else {
        ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
    }

    if (pFrameCountOut != NULL) {
        *pFrameCountOut = totalFrameCount;
    }

    ma_decoder_uninit(pDecoder);
    return MA_SUCCESS;
}